

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projector.h
# Opt level: O0

void __thiscall Projector::Projector(Projector *this,ofstream *myFile)

{
  ostream *poVar1;
  ostream *in_RSI;
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  cv::Mat::Mat((Mat *)(in_RDI + 0x28));
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"PROJECTOR INITIALIZED!");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"PROJECTOR INITIALIZED!");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

Projector::Projector(ofstream &myFile)
{
	//Initializez Projector

	cout << endl << "PROJECTOR INITIALIZED!" << endl << endl;
	myFile << endl << "PROJECTOR INITIALIZED!" << endl << endl;
}